

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

void __thiscall cpptempl::data_ptr::operator=(data_ptr *this,param *data)

{
  ostream *in_RDI;
  string data_str;
  stringstream ss;
  param *in_stack_fffffffffffffe28;
  string local_1c8 [48];
  string *in_stack_fffffffffffffe68;
  data_ptr *in_stack_fffffffffffffe70;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffe68);
  nonius::operator<<(in_RDI,in_stack_fffffffffffffe28);
  std::ios::exceptions
            ((int)&stack0xfffffffffffffe68 + (int)in_stack_fffffffffffffe68[-1]._M_string_length);
  std::__cxx11::stringstream::str();
  operator=(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffe68);
  return;
}

Assistant:

void data_ptr::operator = (const T& data) {
        std::stringstream ss;
        ss << data;
        ss.exceptions(std::ios::failbit);
        std::string data_str = ss.str();
        this->operator =(data_str);
    }